

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O1

Belief * __thiscall
despot::NoisyLaserTag::InitialBelief(NoisyLaserTag *this,State *start,string type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  StateIndexer *pSVar5;
  int opp;
  int iVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  double local_58;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_50;
  State *local_38;
  
  if (start != (State *)0x0) {
    local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = despot::Floor::NumCells();
    if (0 < iVar2) {
      local_58 = (1.0 / (double)iVar2) / (double)iVar2;
      iVar3 = 0;
      do {
        iVar6 = 0;
        do {
          iVar1 = (this->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[*(int *)(start + 0xc)];
          iVar4 = despot::Floor::NumCells();
          local_38 = (State *)(**(code **)(*(long *)&this->super_BaseTag + 0xe0))
                                        (SUB84(local_58,0),this,iVar4 * iVar1 + iVar6);
          std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)&local_78,&local_38);
          iVar6 = iVar6 + 1;
        } while (iVar2 != iVar6);
        iVar3 = iVar3 + 1;
      } while (iVar3 != iVar2);
    }
    pSVar5 = (StateIndexer *)operator_new(0x90);
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(&local_50,&local_78);
    despot::ParticleBelief::ParticleBelief
              ((ParticleBelief *)pSVar5,&local_50,&(this->super_BaseTag).super_BeliefMDP,0,1);
    if (local_50.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    despot::ParticleBelief::state_indexer(pSVar5);
    if (local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return (Belief *)pSVar5;
  }
  __assert_fail("start != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/examples/cpp_models/tag/src/noisy_laser_tag/noisy_laser_tag.cpp"
                ,0x97,
                "virtual Belief *despot::NoisyLaserTag::InitialBelief(const State *, string) const")
  ;
}

Assistant:

Belief* NoisyLaserTag::InitialBelief(const State* start, string type) const {
	assert(start != NULL);

	vector<State*> particles;
	int N = floor_.NumCells();
	double wgt = 1.0 / N / N;
	for (int rob = 0; rob < N; rob++) {
		for (int opp = 0; opp < N; opp++) {
			TagState* state = static_cast<TagState*>(Allocate(
				RobOppIndicesToStateIndex(rob_[start->state_id], opp), wgt));
			particles.push_back(state);
		}
	}

	ParticleBelief* belief = new ParticleBelief(particles, this);
	belief->state_indexer(this);
	return belief;
}